

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

sxi32 GenStateProcessStringExpression(jx9_gen_state *pGen,char *zIn,char *zEnd)

{
  SyToken *pSVar1;
  SyToken *pSVar2;
  sxi32 sVar3;
  SySet local_50;
  
  local_50.pAllocator = &pGen->pVm->sAllocator;
  local_50.nUsed = 0;
  local_50.nSize = 0;
  local_50.eSize = 0x20;
  local_50.nCursor = 0;
  local_50.pBase = (SyToken *)0x0;
  local_50.pUserData = (void *)0x0;
  SySetAlloc(&local_50,8);
  jx9Tokenize(zIn,(int)zEnd - (int)zIn,&local_50);
  pSVar1 = pGen->pIn;
  pSVar2 = pGen->pEnd;
  pGen->pIn = (SyToken *)local_50.pBase;
  pGen->pEnd = (SyToken *)((long)local_50.pBase + (local_50._16_8_ & 0xffffffff) * 0x20);
  sVar3 = jx9CompileExpr(pGen,0,(_func_sxi32_jx9_gen_state_ptr_jx9_expr_node_ptr *)0x0);
  pGen->pIn = pSVar1;
  pGen->pEnd = pSVar2;
  SySetRelease(&local_50);
  return sVar3;
}

Assistant:

static sxi32 GenStateProcessStringExpression(
	jx9_gen_state *pGen, /* Code generator state */
	const char *zIn,     /* Raw expression */
	const char *zEnd     /* End of the expression */
	)
{
	SyToken *pTmpIn, *pTmpEnd;
	SySet sToken;
	sxi32 rc;
	/* Initialize the token set */
	SySetInit(&sToken, &pGen->pVm->sAllocator, sizeof(SyToken));
	/* Preallocate some slots */
	SySetAlloc(&sToken, 0x08);
	/* Tokenize the text */
	jx9Tokenize(zIn,(sxu32)(zEnd-zIn),&sToken);
	/* Swap delimiter */
	pTmpIn  = pGen->pIn;
	pTmpEnd = pGen->pEnd;
	pGen->pIn = (SyToken *)SySetBasePtr(&sToken);
	pGen->pEnd = &pGen->pIn[SySetUsed(&sToken)];
	/* Compile the expression */
	rc = jx9CompileExpr(&(*pGen), 0, 0);
	/* Restore token stream */
	pGen->pIn  = pTmpIn;
	pGen->pEnd = pTmpEnd;
	/* Release the token set */
	SySetRelease(&sToken);
	/* Compilation result */
	return rc;
}